

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void test_connect(void)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  int iVar4;
  string str;
  rpc_client client;
  timespec local_428;
  undefined1 local_418 [16];
  rpc_client local_408;
  
  rest_rpc::rpc_client::rpc_client(&local_408);
  local_408.enable_reconnect_ = true;
  local_408.reconnect_cnt_ = 0x7fffffff;
  rest_rpc::rpc_client::reset_deadline_timer(&local_408,5);
  local_428.tv_sec = (__time_t)local_418;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"127.0.0.1","");
  rest_rpc::rpc_client::connect(&local_408,(int)&local_428,(sockaddr *)0x2328,0);
  if ((undefined1 *)local_428.tv_sec != local_418) {
    operator_delete((void *)local_428.tv_sec);
  }
  if (((byte)local_408.has_connected_._M_base._M_i & 1) == 0) {
    iVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"connected failed: ",0x12);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      iVar4 = iVar4 + 1;
      local_428.tv_sec = 1;
      local_428.tv_nsec = 0;
      do {
        iVar1 = nanosleep(&local_428,&local_428);
        if (iVar1 != -1) break;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
    } while (((byte)local_408.has_connected_._M_base._M_i & 1) == 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"connected ok\n",0xd);
  local_428.tv_nsec = 0;
  local_418[0] = 0;
  local_428.tv_sec = (__time_t)local_418;
  std::operator>>((istream *)&std::cin,(string *)&local_428);
  if ((undefined1 *)local_428.tv_sec != local_418) {
    operator_delete((void *)local_428.tv_sec);
  }
  rest_rpc::rpc_client::~rpc_client(&local_408);
  return;
}

Assistant:

void test_connect() {
  rpc_client client;
  client.enable_auto_reconnect(); // automatic reconnect
  client.enable_auto_heartbeat(); // automatic heartbeat
  bool r = client.connect("127.0.0.1", 9000);
  int count = 0;
  while (true) {
    if (client.has_connected()) {
      std::cout << "connected ok\n";
      break;
    } else {
      std::cout << "connected failed: " << count++ << "\n";
    }
    std::this_thread::sleep_for(std::chrono::seconds(1));
  }

  //{
  //	rpc_client client;
  //	bool r = client.connect("127.0.0.1", 9000);
  //	int count = 0;
  //	while (true) {
  //		if (client.connect()) {
  //			std::cout << "connected ok\n";
  //			break;
  //		}
  //		else {
  //			std::cout << "connected failed: " << count++ << "\n";
  //		}
  //	}
  //}

  std::string str;
  std::cin >> str;
}